

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O1

bool bssl::ssl_parse_server_hello(ParsedServerHello *out,uint8_t *out_alert,SSLMessage *msg)

{
  size_t sVar1;
  int iVar2;
  int line;
  CBS body;
  CBS local_28;
  
  if (msg->type != '\x02') {
    ERR_put_error(0x10,0,0xdf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                  ,0x220);
    *out_alert = '\n';
    return false;
  }
  sVar1 = (msg->raw).len;
  (out->raw).data = (msg->raw).data;
  (out->raw).len = sVar1;
  local_28.data = (msg->body).data;
  local_28.len = (msg->body).len;
  iVar2 = CBS_get_u16(&local_28,&out->legacy_version);
  line = 0x22c;
  if (((((iVar2 != 0) && (iVar2 = CBS_get_bytes(&local_28,&out->random,0x20), iVar2 != 0)) &&
       (iVar2 = CBS_get_u8_length_prefixed(&local_28,&out->session_id), iVar2 != 0)) &&
      (((out->session_id).len < 0x21 &&
       (iVar2 = CBS_get_u16(&local_28,&out->cipher_suite), iVar2 != 0)))) &&
     (iVar2 = CBS_get_u8(&local_28,&out->compression_method), iVar2 != 0)) {
    (out->extensions).data = (uint8_t *)0x0;
    (out->extensions).len = 0;
    if (local_28.len == 0) {
      return true;
    }
    iVar2 = CBS_get_u16_length_prefixed(&local_28,&out->extensions);
    line = 0x236;
    if ((iVar2 != 0) && (local_28.len == 0)) {
      return true;
    }
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                ,line);
  *out_alert = '2';
  return false;
}

Assistant:

bool ssl_parse_server_hello(ParsedServerHello *out, uint8_t *out_alert,
                            const SSLMessage &msg) {
  if (msg.type != SSL3_MT_SERVER_HELLO) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_MESSAGE);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return false;
  }
  out->raw = msg.raw;
  CBS body = msg.body;
  if (!CBS_get_u16(&body, &out->legacy_version) ||
      !CBS_get_bytes(&body, &out->random, SSL3_RANDOM_SIZE) ||
      !CBS_get_u8_length_prefixed(&body, &out->session_id) ||
      CBS_len(&out->session_id) > SSL3_SESSION_ID_SIZE ||
      !CBS_get_u16(&body, &out->cipher_suite) ||
      !CBS_get_u8(&body, &out->compression_method)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  // In TLS 1.2 and below, empty extensions blocks may be omitted. In TLS 1.3,
  // ServerHellos always have extensions, so this can be applied generically.
  CBS_init(&out->extensions, nullptr, 0);
  if ((CBS_len(&body) != 0 &&
       !CBS_get_u16_length_prefixed(&body, &out->extensions)) ||
      CBS_len(&body) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  return true;
}